

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decompiler.cc
# Opt level: O3

Value * __thiscall
wabt::Decompiler::WrapNAry
          (Value *__return_storage_ptr__,Decompiler *this,
          vector<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_> *args,
          string_view prefix,string_view postfix,Precedence precedence)

{
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *__x;
  pointer pVVar1;
  pointer pbVar2;
  pointer pbVar3;
  const_iterator __position;
  byte bVar4;
  byte bVar5;
  long lVar6;
  char *pcVar7;
  size_t amount;
  Value *child_2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__args;
  pointer pVVar8;
  pointer pVVar9;
  size_t sVar10;
  ulong uVar11;
  Value *child_1;
  ulong uVar12;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *s;
  pointer pbVar13;
  ulong uVar14;
  ulong uVar15;
  bool bVar16;
  string_view first_indent;
  string s_1;
  string_view local_a8;
  undefined1 local_98 [40];
  Decompiler *local_70;
  pointer local_68;
  pointer local_60;
  undefined1 local_58 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_48;
  undefined8 local_38;
  
  local_a8.size_ = prefix.size_;
  local_a8.data_ = prefix.data_;
  pVVar8 = (args->
           super__Vector_base<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_>).
           _M_impl.super__Vector_impl_data._M_start;
  pVVar1 = (args->
           super__Vector_base<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_>).
           _M_impl.super__Vector_impl_data._M_finish;
  if (pVVar8 != pVVar1) {
    lVar6 = 0;
    uVar12 = 0;
    pVVar9 = pVVar8;
    bVar5 = 0;
    do {
      bVar4 = bVar5;
      pbVar3 = (pVVar9->v).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      uVar11 = 0;
      pbVar2 = (pVVar9->v).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      for (pbVar13 = pbVar2; pbVar13 != pbVar3; pbVar13 = pbVar13 + 1) {
        if (uVar11 <= pbVar13->_M_string_length) {
          uVar11 = pbVar13->_M_string_length;
        }
      }
      if (uVar12 <= uVar11) {
        uVar12 = uVar11;
      }
      lVar6 = lVar6 + uVar11;
      bVar16 = 0x20 < (ulong)((long)pbVar3 - (long)pbVar2);
      pVVar9 = pVVar9 + 1;
      bVar5 = bVar4 | bVar16;
    } while (pVVar9 != pVVar1);
    if (((bool)(bVar4 | bVar16)) ||
       (this->target_exp_width <= lVar6 + local_a8.size_ + postfix.size_ && pVVar8 != pVVar1)) {
      local_98._0_8_ = (pointer)0x0;
      local_98._8_8_ = (pointer)0x0;
      local_98._16_8_ = (pointer)0x0;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&__return_storage_ptr__->v,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_98);
      __return_storage_ptr__->precedence = precedence;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_98);
      uVar12 = uVar12 + local_a8.size_;
      uVar11 = this->target_exp_width;
      pVVar8 = (args->
               super__Vector_base<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_>
               )._M_impl.super__Vector_impl_data._M_start;
      pVVar1 = (args->
               super__Vector_base<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_>
               )._M_impl.super__Vector_impl_data._M_finish;
      if (pVVar8 != pVVar1) {
        uVar15 = 0;
        local_70 = this;
        do {
          if (uVar12 < uVar11) {
            pcVar7 = local_a8.data_;
            amount = local_a8.size_;
            sVar10 = local_a8.size_;
            if (uVar15 != 0) goto LAB_0014c615;
          }
          else {
            amount = local_70->indent_amount;
LAB_0014c615:
            pcVar7 = (char *)0x0;
            sVar10 = 0;
          }
          first_indent.size_ = sVar10;
          first_indent.data_ = pcVar7;
          IndentValue(local_70,pVVar8,amount,first_indent);
          if (uVar15 < ((long)(args->
                              super__Vector_base<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_>
                              )._M_impl.super__Vector_impl_data._M_finish -
                        (long)(args->
                              super__Vector_base<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_>
                              )._M_impl.super__Vector_impl_data._M_start >> 5) - 1U) {
            std::__cxx11::string::append
                      ((char *)((pVVar8->v).
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish + -1));
          }
          __args = (pVVar8->v).
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          lVar6 = (long)(pVVar8->v).
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish - (long)__args >> 5;
          if (0 < lVar6) {
            uVar14 = lVar6 + 1;
            do {
              std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
              emplace_back<std::__cxx11::string>
                        ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                         __return_storage_ptr__,__args);
              __args = __args + 1;
              uVar14 = uVar14 - 1;
            } while (1 < uVar14);
          }
          uVar15 = uVar15 + 1;
          pVVar8 = pVVar8 + 1;
        } while (pVVar8 != pVVar1);
      }
      if (uVar11 <= uVar12) {
        __position._M_current =
             (__return_storage_ptr__->v).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
        string_view::operator_cast_to_string((string *)local_98,&local_a8);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::_M_insert_rval(&__return_storage_ptr__->v,__position,(string *)local_98);
        if ((pointer)local_98._0_8_ != (pointer)(local_98 + 0x10)) {
          operator_delete((void *)local_98._0_8_);
        }
      }
      std::__cxx11::string::append
                ((char *)((__return_storage_ptr__->v).
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish + -1),(ulong)postfix.data_);
      return __return_storage_ptr__;
    }
  }
  string_view::operator_cast_to_string((string *)local_98,&local_a8);
  pVVar8 = (args->
           super__Vector_base<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_>).
           _M_impl.super__Vector_impl_data._M_start;
  pVVar1 = (args->
           super__Vector_base<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_>).
           _M_impl.super__Vector_impl_data._M_finish;
  if (pVVar8 != pVVar1) {
    do {
      if (pVVar8 != (args->
                    super__Vector_base<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_>
                    )._M_impl.super__Vector_impl_data._M_start) {
        std::__cxx11::string::append(local_98);
      }
      std::__cxx11::string::_M_append
                (local_98,(ulong)(((pVVar8->v).
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p);
      pVVar8 = pVVar8 + 1;
    } while (pVVar8 != pVVar1);
  }
  std::__cxx11::string::append(local_98,(ulong)postfix.data_);
  pbVar2 = (pointer)(local_98 + 0x10);
  if ((pointer)local_98._0_8_ == pbVar2) {
    local_58._8_8_ = local_98._24_8_;
    local_68 = (pointer)local_58;
  }
  else {
    local_68 = (pointer)local_98._0_8_;
  }
  local_60 = (pointer)local_98._8_8_;
  local_98._8_8_ = (pointer)0x0;
  local_98._16_8_ = local_98._16_8_ & 0xffffffffffffff00;
  __x = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)(local_58 + 0x10);
  local_48._M_allocated_capacity = 0;
  local_48._8_8_ = 0;
  local_38 = 0;
  local_98._0_8_ = pbVar2;
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  _M_range_initialize<std::__cxx11::string_const*>(__x,&local_68);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&__return_storage_ptr__->v,
           (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)__x);
  __return_storage_ptr__->precedence = precedence;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)__x);
  if (local_68 != (pointer)local_58) {
    operator_delete(local_68);
  }
  if ((pointer)local_98._0_8_ != pbVar2) {
    operator_delete((void *)local_98._0_8_);
  }
  return __return_storage_ptr__;
}

Assistant:

Value WrapNAry(std::vector<Value>& args, string_view prefix,
                 string_view postfix, Precedence precedence) {
    size_t total_width = 0;
    size_t max_width = 0;
    bool multiline = false;
    for (auto& child : args) {
      auto w = child.width();
      max_width = std::max(max_width, w);
      total_width += w;
      multiline = multiline || child.v.size() > 1;
    }
    if (!multiline &&
        (total_width + prefix.size() + postfix.size() < target_exp_width ||
         args.empty())) {
      // Single line.
      auto s = std::string(prefix);
      for (auto& child : args) {
        if (&child != &args[0])
          s += ", ";
        s += child.v[0];
      }
      s += postfix;
      return Value{{std::move(s)}, precedence};
    } else {
      // Multi-line.
      Value ml { {}, precedence };
      auto ident_with_name = max_width + prefix.size() < target_exp_width;
      size_t i = 0;
      for (auto& child : args) {
        IndentValue(child, ident_with_name ? prefix.size() : indent_amount,
                    !i && ident_with_name ? prefix : string_view {});
        if (i < args.size() - 1) child.v.back() += ",";
        std::move(child.v.begin(), child.v.end(),
                  std::back_inserter(ml.v));
        i++;
      }
      if (!ident_with_name) ml.v.insert(ml.v.begin(), std::string(prefix));
      ml.v.back() += postfix;
      return ml;
    }
  }